

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorSetRow(VP8EncIterator *it,int y)

{
  VP8Encoder *pVVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  pVVar1 = it->enc;
  it->x = 0;
  it->y = y;
  uVar3 = (ulong)y;
  it->bw = pVVar1->parts + ((long)pVVar1->num_parts - 1U & uVar3);
  it->preds = pVVar1->preds + (long)pVVar1->preds_w * uVar3 * 4;
  it->nz = pVVar1->nz;
  it->mb = pVVar1->mb_info + (long)pVVar1->mb_w * uVar3;
  puVar2 = pVVar1->uv_top;
  it->y_top = pVVar1->y_top;
  it->uv_top = puVar2;
  InitLeft(it);
  return;
}

Assistant:

void VP8IteratorSetRow(VP8EncIterator* const it, int y) {
  VP8Encoder* const enc = it->enc;
  it->x = 0;
  it->y = y;
  it->bw = &enc->parts[y & (enc->num_parts - 1)];
  it->preds = enc->preds + y * 4 * enc->preds_w;
  it->nz = enc->nz;
  it->mb = enc->mb_info + y * enc->mb_w;
  it->y_top = enc->y_top;
  it->uv_top = enc->uv_top;
  InitLeft(it);
}